

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

string * vk::BinaryRegistryDetail::anon_unknown_8::getProgramPath
                   (string *__return_storage_ptr__,string *dirName,deUint32 index)

{
  char *__s;
  deUint32 index_00;
  allocator<char> local_ad [13];
  string local_a0;
  FilePath local_80;
  FilePath local_60;
  FilePath local_40;
  uint local_1c;
  string *psStack_18;
  deUint32 index_local;
  string *dirName_local;
  
  local_1c = index;
  psStack_18 = dirName;
  dirName_local = __return_storage_ptr__;
  de::FilePath::FilePath(&local_60,dirName);
  BinaryRegistryDetail::(anonymous_namespace)::getProgramFileName_abi_cxx11_
            (&local_a0,(_anonymous_namespace_ *)(ulong)local_1c,index_00);
  de::FilePath::FilePath(&local_80,&local_a0);
  de::FilePath::join(&local_40,&local_60,&local_80);
  __s = de::FilePath::getPath(&local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,local_ad);
  std::allocator<char>::~allocator(local_ad);
  de::FilePath::~FilePath(&local_40);
  de::FilePath::~FilePath(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  de::FilePath::~FilePath(&local_60);
  return __return_storage_ptr__;
}

Assistant:

string getProgramPath (const std::string& dirName, deUint32 index)
{
	return de::FilePath::join(dirName, getProgramFileName(index)).getPath();
}